

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O1

StringTree * __thiscall
kj::strTree<int,char_const(&)[2],unsigned_int,char_const(&)[2],long,char_const(&)[2],long_long>
          (StringTree *__return_storage_ptr__,kj *this,int *params,char (*params_1) [2],
          uint *params_2,char (*params_3) [2],long *params_4,char (*params_5) [2],longlong *params_6
          )

{
  CappedArray<char,_26UL> *in_stack_ffffffffffffff18;
  undefined1 local_e0 [16];
  CappedArray<char,_14UL> local_d0;
  undefined1 local_b8 [32];
  Branch *local_98;
  undefined1 local_90 [16];
  CappedArray<char,_26UL> local_80;
  CappedArray<char,_26UL> local_58;
  
  _::Stringifier::operator*((CappedArray<char,_14UL> *)local_b8,(Stringifier *)&_::STR,*(int *)this)
  ;
  local_e0._8_8_ = strlen((char *)params);
  local_e0._0_8_ = params;
  _::Stringifier::operator*
            ((CappedArray<char,_14UL> *)(local_e0 + 0x10),(Stringifier *)&_::STR,*(uint *)params_1);
  local_90._8_8_ = strlen((char *)params_2);
  local_90._0_8_ = params_2;
  _::Stringifier::operator*(&local_58,(Stringifier *)&_::STR,*(long *)params_3);
  local_98 = (Branch *)strlen((char *)params_4);
  local_b8._24_8_ = params_4;
  _::Stringifier::operator*(&local_80,(Stringifier *)&_::STR,*(longlong *)params_5);
  StringTree::
  concat<kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::CappedArray<char,26ul>,kj::ArrayPtr<char_const>,kj::CappedArray<char,26ul>>
            (__return_storage_ptr__,(StringTree *)local_b8,(CappedArray<char,_14UL> *)local_e0,
             (ArrayPtr<const_char> *)(local_e0 + 0x10),(CappedArray<char,_14UL> *)local_90,
             (ArrayPtr<const_char> *)&local_58,(CappedArray<char,_26UL> *)(local_b8 + 0x18),
             (ArrayPtr<const_char> *)&local_80,in_stack_ffffffffffffff18);
  return __return_storage_ptr__;
}

Assistant:

StringTree strTree(Params&&... params) {
  return StringTree::concat(_::toStringTreeOrCharSequence(kj::fwd<Params>(params))...);
}